

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.cpp
# Opt level: O2

string * __thiscall ASTree::yield_abi_cxx11_(string *__return_storage_ptr__,ASTree *this)

{
  pointer ppAVar1;
  pointer ppAVar2;
  string local_40;
  
  ppAVar2 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar1 = (this->subtrees).super__Vector_base<ASTree_*,_std::allocator<ASTree_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar1 == ppAVar2) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->root);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    for (; ppAVar2 != ppAVar1; ppAVar2 = ppAVar2 + 1) {
      yield_abi_cxx11_(&local_40,*ppAVar2);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_40);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ASTree::yield() {
    if(subtrees.size() == 0){
        // terminal
        return root;
    }
    std::string yield;
    for(auto subtree: subtrees){
        yield += subtree->yield();
    }
    return yield;
}